

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void __thiscall
wallet::wallet_tests::write_wallet_settings_concurrently::test_method
          (write_wallet_settings_concurrently *this)

{
  bool bVar1;
  anon_class_8_1_a7bdc5e1 aVar2;
  long in_FS_OFFSET;
  anon_class_8_1_a7bdc5e1 *check_concurrent_wallet;
  int NUM_WALLETS;
  pointer chain;
  UniValue *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  assertion_result *in_stack_fffffffffffffe78;
  anon_class_8_1_a7bdc5e1 *this_00;
  const_string *msg;
  undefined1 *line_num;
  const_string *file;
  anon_class_8_1_a7bdc5e1 in_stack_fffffffffffffea8;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  type *in_stack_fffffffffffffee0;
  anon_class_8_1_a7bdc5e1 *this_01;
  const_string local_108 [2];
  lazy_ostream local_e8 [2];
  allocator<char> local_c1;
  assertion_result local_c0;
  const_string local_a8;
  undefined1 local_98 [16];
  int in_stack_ffffffffffffff84;
  undefined1 local_60 [88];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  aVar2.chain = (pointer *)
                std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
                          ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *
                           )in_stack_fffffffffffffe68);
  do {
    line_num = local_98;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
               (pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               (unsigned_long)in_stack_fffffffffffffe68);
    file = &local_a8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffea8.chain,file,(size_t)line_num,msg);
    in_stack_fffffffffffffea8.chain = aVar2.chain;
    __s = &local_c1;
    aVar2.chain = in_stack_fffffffffffffea8.chain;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffeb8,(char *)__s,
               (allocator<char> *)in_stack_fffffffffffffea8.chain);
    (**(code **)((long)*in_stack_fffffffffffffea8.chain + 0x180))
              (local_60,in_stack_fffffffffffffea8.chain,&stack0xffffffffffffff80);
    UniValue::isNull(in_stack_fffffffffffffe68);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffe78,(bool)in_stack_fffffffffffffe77);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
               (pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               (unsigned_long)in_stack_fffffffffffffe68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               (basic_cstring<const_char> *)in_stack_fffffffffffffe68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
               (pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               (unsigned_long)in_stack_fffffffffffffe68);
    in_stack_fffffffffffffe68 = (UniValue *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_c0,local_e8,local_108,0x155,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffe68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe68);
    UniValue::~UniValue(in_stack_fffffffffffffe68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe68);
    std::allocator<char>::~allocator(&local_c1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  this_00 = (anon_class_8_1_a7bdc5e1 *)&stack0xffffffffffffff78;
  this_01 = this_00;
  test_method()::$_0::operator()(this_00,in_stack_fffffffffffffee0,in_stack_ffffffffffffff84);
  test_method()::$_0::operator()(this_01,(type *)this_00,in_stack_ffffffffffffff84);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(write_wallet_settings_concurrently, TestingSetup)
{
    auto chain = m_node.chain.get();
    const auto NUM_WALLETS{5};

    // Since we're counting the number of wallets, ensure we start without any.
    BOOST_REQUIRE(chain->getRwSetting("wallet").isNull());

    const auto& check_concurrent_wallet = [&](const auto& settings_function, int num_expected_wallets) {
        std::vector<std::thread> threads;
        threads.reserve(NUM_WALLETS);
        for (auto i{0}; i < NUM_WALLETS; ++i) threads.emplace_back(settings_function, i);
        for (auto& t : threads) t.join();

        auto wallets = chain->getRwSetting("wallet");
        BOOST_CHECK_EQUAL(wallets.getValues().size(), num_expected_wallets);
    };

    // Add NUM_WALLETS wallets concurrently, ensure we end up with NUM_WALLETS stored.
    check_concurrent_wallet([&chain](int i) {
        Assert(AddWalletSetting(*chain, strprintf("wallet_%d", i)));
    },
                            /*num_expected_wallets=*/NUM_WALLETS);

    // Remove NUM_WALLETS wallets concurrently, ensure we end up with 0 wallets.
    check_concurrent_wallet([&chain](int i) {
        Assert(RemoveWalletSetting(*chain, strprintf("wallet_%d", i)));
    },
                            /*num_expected_wallets=*/0);
}